

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

void Gia_ManDupMapped_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  pGVar5 = p->pObjs;
  if ((pObj < pGVar5) || (pGVar5 + p->nObjs <= pObj)) goto LAB_005fed49;
  iVar2 = (int)((long)pObj - (long)pGVar5 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar2] == p->nTravIds) {
    return;
  }
  p->pTravIds[iVar2] = p->nTravIds;
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar3 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar3 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x2ea,"void Gia_ManDupMapped_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *)");
  }
  Gia_ManDupMapped_rec(p,pObj + -(ulong)uVar3,pNew);
  Gia_ManDupMapped_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),pNew);
  uVar7 = *(ulong *)pObj;
  uVar3 = pObj[-(uVar7 & 0x1fffffff)].Value;
  if ((int)uVar3 < 0) {
LAB_005fed87:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  uVar4 = (uint)(uVar7 >> 0x20);
  uVar13 = pObj[-(ulong)(uVar4 & 0x1fffffff)].Value;
  if ((int)uVar13 < 0) goto LAB_005fed87;
  pGVar5 = Gia_ManAppendObj(pNew);
  uVar8 = uVar3 >> 1;
  iVar2 = pNew->nObjs;
  if (iVar2 <= (int)uVar8) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  uVar6 = uVar13 >> 1;
  if (iVar2 <= (int)uVar6) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  if ((uVar8 == uVar6) && (pNew->fGiaSimple == 0)) {
    __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  uVar3 = (uint)(uVar7 >> 0x1d) & 1 ^ uVar3;
  uVar13 = uVar13 ^ uVar4 >> 0x1d & 1;
  pGVar1 = pNew->pObjs;
  iVar10 = (int)pGVar5;
  if ((int)uVar3 < (int)uVar13) {
    if (pGVar1 + iVar2 <= pGVar5 || pGVar5 < pGVar1) goto LAB_005fed49;
    uVar7 = *(ulong *)pGVar5;
    uVar11 = (ulong)((uVar3 & 1) << 0x1d |
                    ((uint)(iVar10 - (int)pGVar1) >> 2) * -0x55555555 - uVar8 & 0x1fffffff);
    *(ulong *)pGVar5 = uVar11 | uVar7 & 0xffffffffc0000000;
    pGVar1 = pNew->pObjs;
    if ((pGVar5 < pGVar1) || (pGVar1 + pNew->nObjs <= pGVar5)) goto LAB_005fed49;
    uVar9 = (ulong)(((uint)(iVar10 - (int)pGVar1) >> 2) * -0x55555555 - uVar6 & 0x1fffffff) << 0x20;
    *(ulong *)pGVar5 = uVar11 | uVar7 & 0xe0000000c0000000 | uVar9;
    uVar14 = (ulong)(uVar13 & 1) << 0x3d;
    uVar9 = uVar11 | uVar7 & 0xc0000000c0000000 | uVar9;
  }
  else {
    if (pGVar1 + iVar2 <= pGVar5 || pGVar5 < pGVar1) goto LAB_005fed49;
    uVar7 = *(ulong *)pGVar5;
    uVar12 = (ulong)(((uint)(iVar10 - (int)pGVar1) >> 2) * -0x55555555 - uVar8 & 0x1fffffff) << 0x20
    ;
    uVar11 = (ulong)(uVar3 & 1) << 0x3d;
    *(ulong *)pGVar5 = uVar11 | uVar7 & 0xc0000000ffffffff | uVar12;
    pGVar1 = pNew->pObjs;
    if ((pGVar5 < pGVar1) || (pGVar1 + pNew->nObjs <= pGVar5)) goto LAB_005fed49;
    uVar9 = (ulong)(((uint)(iVar10 - (int)pGVar1) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
    *(ulong *)pGVar5 = uVar11 | uVar7 & 0xc0000000e0000000 | uVar12 | uVar9;
    uVar14 = (ulong)((uVar13 & 1) << 0x1d);
    uVar9 = uVar11 | uVar7 & 0xc0000000c0000000 | uVar12 | uVar9;
  }
  *(ulong *)pGVar5 = uVar9 | uVar14;
  if (pNew->pFanData != (int *)0x0) {
    Gia_ObjAddFanout(pNew,pGVar5 + -(uVar9 & 0x1fffffff),pGVar5);
    Gia_ObjAddFanout(pNew,pGVar5 + -((ulong)*(uint *)&pGVar5->field_0x4 & 0x1fffffff),pGVar5);
  }
  if (pNew->fSweeper != 0) {
    uVar11 = *(ulong *)pGVar5 & 0x1fffffff;
    uVar7 = *(ulong *)pGVar5 >> 0x20 & 0x1fffffff;
    uVar12 = 0x4000000000000000;
    uVar9 = 0x4000000000000000;
    if (((uint)*(ulong *)(pGVar5 + -uVar11) >> 0x1e & 1) == 0) {
      uVar9 = 0x40000000;
    }
    *(ulong *)(pGVar5 + -uVar11) = uVar9 | *(ulong *)(pGVar5 + -uVar11);
    uVar9 = *(ulong *)(pGVar5 + -uVar7);
    if (((uint)uVar9 >> 0x1e & 1) == 0) {
      uVar12 = 0x40000000;
    }
    *(ulong *)(pGVar5 + -uVar7) = uVar12 | uVar9;
    uVar7 = *(ulong *)pGVar5;
    *(ulong *)pGVar5 =
         uVar7 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar7 >> 0x3d) ^ (uint)(uVar9 >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pGVar5 + -uVar11) >> 0x3f) ^
                (uint)(uVar7 >> 0x1d) & 7)) << 0x3f;
  }
  if (pNew->fBuiltInSim != 0) {
    uVar7 = *(ulong *)pGVar5;
    *(ulong *)pGVar5 =
         uVar7 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar7 >> 0x3d) ^
                 (uint)((ulong)*(undefined8 *)(pGVar5 + -(uVar7 >> 0x20 & 0x1fffffff)) >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pGVar5 + -(uVar7 & 0x1fffffff)) >> 0x3f) ^
                (uint)(uVar7 >> 0x1d) & 7)) << 0x3f;
    pGVar1 = pNew->pObjs;
    if ((pGVar5 < pGVar1) || (pGVar1 + pNew->nObjs <= pGVar5)) goto LAB_005fed49;
    Gia_ManBuiltInSimPerform(pNew,(int)((ulong)((long)pGVar5 - (long)pGVar1) >> 2) * -0x55555555);
  }
  if (pNew->vSuppWords != (Vec_Wrd_t *)0x0) {
    Gia_ManQuantSetSuppAnd(pNew,pGVar5);
  }
  pGVar1 = pNew->pObjs;
  if ((pGVar1 <= pGVar5) && (pGVar5 < pGVar1 + pNew->nObjs)) {
    pObj->Value = (int)((ulong)((long)pGVar5 - (long)pGVar1) >> 2) * 0x55555556;
    pGVar5 = p->pObjs;
    if ((pGVar5 <= pObj) && (pObj < pGVar5 + p->nObjs)) {
      Vec_IntPush(pNew->vLutConfigs,(int)((ulong)((long)pObj - (long)pGVar5) >> 2) * -0x55555555);
      return;
    }
  }
LAB_005fed49:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManDupMapped_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManDupMapped_rec( p, Gia_ObjFanin0(pObj), pNew );
    Gia_ManDupMapped_rec( p, Gia_ObjFanin1(pObj), pNew );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Vec_IntPush( pNew->vLutConfigs, Gia_ObjId(p, pObj) );
}